

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void arena_decay(tsdn_t *tsdn,arena_t *arena,_Bool is_background_thread,_Bool all)

{
  _Bool _Var1;
  
  _Var1 = arena_decay_impl(tsdn,arena,&arena->decay_dirty,&arena->extents_dirty,is_background_thread
                           ,all);
  if (_Var1) {
    return;
  }
  arena_decay_impl(tsdn,arena,&arena->decay_muzzy,&arena->extents_muzzy,is_background_thread,all);
  return;
}

Assistant:

void
arena_decay(tsdn_t *tsdn, arena_t *arena, bool is_background_thread, bool all) {
	if (arena_decay_dirty(tsdn, arena, is_background_thread, all)) {
		return;
	}
	arena_decay_muzzy(tsdn, arena, is_background_thread, all);
}